

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  byte *pbVar4;
  Message *pMVar5;
  uchar value;
  long in_FS_OFFSET;
  ulong local_60;
  size_t i;
  bool is_attribute_local;
  string *str_local;
  char local_3b [3];
  char ch;
  Message m;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Message::Message((Message *)&stack0xffffffffffffffc8);
  for (local_60 = 0; uVar3 = std::__cxx11::string::size(), local_60 < uVar3; local_60 = local_60 + 1
      ) {
    pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)str);
    local_3b[2] = *pbVar4;
    switch(local_3b[2]) {
    case '\"':
      if (is_attribute) {
        Message::operator<<((Message *)&stack0xffffffffffffffc8,(char (*) [7])"&quot;");
      }
      else {
        local_3b[0] = '\"';
        Message::operator<<((Message *)&stack0xffffffffffffffc8,local_3b);
      }
      break;
    default:
      bVar2 = IsValidXmlCharacter(local_3b[2]);
      if (bVar2) {
        if ((is_attribute) && (bVar2 = IsNormalizableWhitespace(local_3b[2]), bVar2)) {
          pMVar5 = Message::operator<<((Message *)&stack0xffffffffffffffc8,(char (*) [4])"&#x");
          String::FormatByte_abi_cxx11_((string *)&m,(String *)(ulong)(byte)local_3b[2],value);
          pMVar5 = Message::operator<<(pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&m);
          Message::operator<<(pMVar5,(char (*) [2])0x1eacd2);
          std::__cxx11::string::~string((string *)&m);
        }
        else {
          Message::operator<<((Message *)&stack0xffffffffffffffc8,local_3b + 2);
        }
      }
      break;
    case '&':
      Message::operator<<((Message *)&stack0xffffffffffffffc8,(char (*) [6])"&amp;");
      break;
    case '\'':
      if (is_attribute) {
        Message::operator<<((Message *)&stack0xffffffffffffffc8,(char (*) [7])"&apos;");
      }
      else {
        local_3b[1] = 0x27;
        Message::operator<<((Message *)&stack0xffffffffffffffc8,local_3b + 1);
      }
      break;
    case '<':
      Message::operator<<((Message *)&stack0xffffffffffffffc8,(char (*) [5])"&lt;");
      break;
    case '>':
      Message::operator<<((Message *)&stack0xffffffffffffffc8,(char (*) [5])"&gt;");
    }
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&stack0xffffffffffffffc8);
  Message::~Message((Message *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}